

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O2

void __thiscall
slang::ast::DeclaredType::mergePortTypes
          (DeclaredType *this,ASTContext *context,ValueSymbol *sourceSymbol,
          ImplicitTypeSyntax *implicit,SourceLocation location,
          span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
          unpackedDimensions)

{
  Token *this_00;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *this_01;
  SymbolKind SVar1;
  bool bVar2;
  bitmask<slang::ast::IntegralFlags> bVar3;
  bitwidth_t width;
  Compilation *pCVar4;
  Type *pTVar5;
  Compilation *compilation;
  Compilation *this_02;
  Compilation *this_03;
  NetSymbol *pNVar6;
  Diagnostic *pDVar7;
  _Storage<slang::ConstantRange,_true> _Var8;
  reference ppVVar9;
  Diagnostic *pDVar10;
  reference ppVVar11;
  reference args_1;
  reference ppVVar12;
  SourceLocation SVar13;
  size_type index;
  string_view sVar14;
  SourceRange SVar15;
  span<const_slang::ConstantRange,_18446744073709551615UL> dimensions;
  optional<slang::ConstantRange> oVar16;
  SmallVector<slang::ConstantRange,_4UL> dims;
  SmallVector<slang::ConstantRange,_4UL> destDims;
  ConstantRange local_a8;
  SmallVectorBase<slang::ConstantRange> local_a0;
  SmallVectorBase<slang::ConstantRange> local_68;
  
  SVar13 = location;
  pCVar4 = (Compilation *)getType(&sourceSymbol->declaredType);
  if ((implicit->signing).info == (Info *)0x0) {
LAB_001cb8f0:
    this->type = (Type *)pCVar4;
    ppVVar9 = unpackedDimensions.data_;
    if (unpackedDimensions.size_ != 0) {
      while( true ) {
        pTVar5 = Type::getCanonicalType((Type *)pCVar4);
        if ((pTVar5->super_Symbol).kind != FixedSizeUnpackedArrayType) break;
        if (ppVVar9 == unpackedDimensions.data_ + unpackedDimensions.size_) {
          ppVVar9 = nonstd::span_lite::
                    span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
                    ::back(&unpackedDimensions);
          goto LAB_001cb97d;
        }
        oVar16 = ASTContext::evalUnpackedDimension(context,*ppVVar9);
        if ((((undefined1  [12])
              oVar16.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
             (undefined1  [12])0x0) ||
           (_Var8._M_value = Type::getFixedRange((Type *)pCVar4),
           _Var8 != oVar16.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload))
        goto LAB_001cb97d;
        pCVar4 = (Compilation *)Type::getArrayElementType((Type *)pCVar4);
        ppVVar9 = ppVVar9 + 1;
      }
      if ((ppVVar9 != unpackedDimensions.data_ + unpackedDimensions.size_) &&
         (bVar2 = Type::isError((Type *)pCVar4), !bVar2)) {
LAB_001cb97d:
        SVar15 = slang::syntax::SyntaxNode::sourceRange(&(*ppVVar9)->super_SyntaxNode);
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar15);
        Diagnostic::operator<<(pDVar10,(sourceSymbol->super_Symbol).name);
        Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
      }
    }
    if ((implicit->dimensions).
        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.size_ != 0) {
      this_01 = &(implicit->dimensions).
                 super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>;
      ppVVar11 = this_01->data_;
      while( true ) {
        pTVar5 = Type::getCanonicalType((Type *)pCVar4);
        ppVVar12 = (implicit->dimensions).
                   super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
                   data_ + (implicit->dimensions).
                           super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                           .size_;
        if ((pTVar5->super_Symbol).kind != PackedArrayType) break;
        if (ppVVar11 == ppVVar12) {
          ppVVar11 = nonstd::span_lite::
                     span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::back
                               (this_01);
          goto LAB_001cba44;
        }
        oVar16 = ASTContext::evalPackedDimension(context,*ppVVar11);
        if ((((undefined1  [12])
              oVar16.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
             (undefined1  [12])0x0) ||
           (_Var8._M_value = Type::getFixedRange((Type *)pCVar4),
           _Var8 != oVar16.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload))
        goto LAB_001cba44;
        pCVar4 = (Compilation *)Type::getArrayElementType((Type *)pCVar4);
        ppVVar11 = ppVVar11 + 1;
      }
      if ((ppVVar11 != ppVVar12) && (bVar2 = Type::isError((Type *)pCVar4), !bVar2)) {
LAB_001cba44:
        SVar15 = slang::syntax::SyntaxNode::sourceRange(&(*ppVVar11)->super_SyntaxNode);
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0x730006,SVar15);
        Diagnostic::operator<<(pDVar10,(sourceSymbol->super_Symbol).name);
        Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
      }
    }
  }
  else {
    this_00 = &implicit->signing;
    local_68.data_ = (pointer)local_68.firstElement;
    local_68.len = 0;
    local_68.cap = 4;
    compilation = pCVar4;
    while (pTVar5 = Type::getCanonicalType((Type *)compilation),
          (pTVar5->super_Symbol).kind == FixedSizeUnpackedArrayType) {
      local_a0.data_ = (pointer)Type::getFixedRange((Type *)compilation);
      SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
                (&local_68,(ConstantRange *)&local_a0);
      compilation = (Compilation *)Type::getArrayElementType((Type *)compilation);
    }
    bVar2 = Type::isError((Type *)compilation);
    if (!bVar2) {
      bVar2 = Type::isIntegral((Type *)compilation);
      if (bVar2) {
        if (this_00->kind == SignedKeyword) {
          bVar2 = Type::isSigned((Type *)compilation);
          if (!bVar2) {
            this_02 = ASTContext::getCompilation(context);
            local_a0.data_ = (pointer)local_a0.firstElement;
            local_a0.len = 0;
            local_a0.cap = 4;
            for (this_03 = compilation; SVar1 = ((Symbol *)&this_03->super_BumpAllocator)->kind,
                SVar1 == PackedArrayType;
                this_03 = (Compilation *)Type::getArrayElementType((Type *)this_03)) {
              local_a8 = Type::getFixedRange((Type *)this_03);
              SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
                        (&local_a0,&local_a8);
            }
            if (SVar1 == ScalarType) {
              bVar3 = Type::getIntegralFlags((Type *)this_03);
              if (local_a0.len == 1) {
                width = Type::getBitWidth((Type *)compilation);
                compilation = (Compilation *)
                              Compilation::getType
                                        (this_02,width,
                                         (bitmask<slang::ast::IntegralFlags>)(bVar3.m_bits | 1));
              }
              else {
                compilation = (Compilation *)
                              Compilation::getScalarType
                                        (this_02,(bitmask<slang::ast::IntegralFlags>)
                                                 (bVar3.m_bits | 1));
                index = local_a0.len;
                while (index = index - 1, index != 0xffffffffffffffff) {
                  args_1 = SmallVectorBase<slang::ConstantRange>::operator[](&local_a0,index);
                  compilation = (Compilation *)
                                BumpAllocator::
                                emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                                          (&this_02->super_BumpAllocator,(Type *)compilation,args_1)
                  ;
                }
              }
            }
            SmallVectorBase<slang::ConstantRange>::~SmallVectorBase(&local_a0);
            bVar2 = Type::isSigned((Type *)compilation);
            if (!bVar2) goto LAB_001cb891;
            pCVar4 = ASTContext::getCompilation(context);
            dimensions.size_ = (size_type)SVar13;
            dimensions.data_ = (pointer)local_68.len;
            pCVar4 = (Compilation *)
                     FixedSizeUnpackedArrayType::fromDims
                               ((FixedSizeUnpackedArrayType *)pCVar4,compilation,
                                (Type *)local_68.data_,dimensions);
          }
        }
        else {
          bVar2 = Type::isSigned((Type *)compilation);
          if (bVar2) {
LAB_001cb891:
            SVar15 = parsing::Token::range(this_00);
            pDVar10 = ASTContext::addDiag(context,(DiagCode)0xb20006,SVar15);
            sVar14 = parsing::Token::valueText(this_00);
            pDVar7 = Diagnostic::operator<<(pDVar10,sVar14);
            ast::operator<<(pDVar7,(Type *)pCVar4);
            Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
          }
        }
        SmallVectorBase<slang::ConstantRange>::~SmallVectorBase(&local_68);
        goto LAB_001cb8f0;
      }
      if (((sourceSymbol->super_Symbol).kind == Net) &&
         (pNVar6 = Symbol::as<slang::ast::NetSymbol>(&sourceSymbol->super_Symbol),
         pNVar6->netType->netKind == Interconnect)) {
        SVar15 = parsing::Token::range(this_00);
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0x510005,SVar15);
        Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
      }
      else {
        pDVar10 = ASTContext::addDiag(context,(DiagCode)0xc0006,location);
        pDVar7 = Diagnostic::operator<<(pDVar10,(sourceSymbol->super_Symbol).name);
        sVar14 = parsing::Token::valueText(this_00);
        pDVar7 = Diagnostic::operator<<(pDVar7,sVar14);
        ast::operator<<(pDVar7,(Type *)pCVar4);
        Diagnostic::addNote(pDVar10,(DiagCode)0x40001,(sourceSymbol->super_Symbol).location);
      }
    }
    SmallVectorBase<slang::ConstantRange>::~SmallVectorBase(&local_68);
  }
  return;
}

Assistant:

void DeclaredType::mergePortTypes(
    const ASTContext& context, const ValueSymbol& sourceSymbol, const ImplicitTypeSyntax& implicit,
    SourceLocation location, span<const VariableDimensionSyntax* const> unpackedDimensions) const {

    // There's this really terrible "feature" where the port declaration can influence the type
    // of the actual symbol somewhere else in the tree. This is ugly but should be safe since
    // nobody else can look at that symbol's type until we've gone through elaboration.
    //
    // In this context, the sourceSymbol is the actual variable declaration with, presumably,
    // a full type declared. The implicit syntax is from the port I/O declaration, which needs
    // to be merged. For example:
    //
    //   input signed [1:0] foo;    // implicit + unpackedDimensions + location
    //   logic foo;                 // sourceSymbol
    const Type* destType = &sourceSymbol.getType();

    if (implicit.signing) {
        // Drill past any unpacked arrays to figure out if this thing is even integral.
        SmallVector<ConstantRange, 4> destDims;
        const Type* sourceType = destType;
        while (sourceType->getCanonicalType().kind == SymbolKind::FixedSizeUnpackedArrayType) {
            destDims.push_back(sourceType->getFixedRange());
            sourceType = sourceType->getArrayElementType();
        }

        if (sourceType->isError())
            return;

        if (!sourceType->isIntegral()) {
            if (sourceSymbol.kind == SymbolKind::Net &&
                sourceSymbol.as<NetSymbol>().netType.netKind == NetType::Interconnect) {
                auto& diag = context.addDiag(diag::InterconnectTypeSyntax,
                                             implicit.signing.range());
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            else {
                auto& diag = context.addDiag(diag::CantDeclarePortSigned, location);
                diag << sourceSymbol.name << implicit.signing.valueText() << *destType;
                diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
            }
            return;
        }

        auto warnSignedness = [&] {
            auto& diag = context.addDiag(diag::SignednessNoEffect, implicit.signing.range());
            diag << implicit.signing.valueText() << *destType;
            diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
        };

        bool shouldBeSigned = implicit.signing.kind == TokenKind::SignedKeyword;
        if (shouldBeSigned && !sourceType->isSigned()) {
            sourceType = makeSigned(context.getCompilation(), *sourceType);
            if (!sourceType->isSigned()) {
                warnSignedness();
            }
            else {
                // Put the unpacked dimensions back on the type now that it
                // has been made signed.
                destType = &FixedSizeUnpackedArrayType::fromDims(context.getCompilation(),
                                                                 *sourceType, destDims);
            }
        }
        else if (!shouldBeSigned && sourceType->isSigned()) {
            warnSignedness();
        }
    }

    // Our declared type takes on the merged type from the variable definition.
    this->type = destType;

    auto errorDims = [&](auto& dims) {
        auto& diag = context.addDiag(diag::PortDeclDimensionsMismatch, dims.sourceRange());
        diag << sourceSymbol.name;
        diag.addNote(diag::NoteDeclarationHere, sourceSymbol.location);
    };

    auto checkDims = [&](auto& dims, SymbolKind arrayKind, bool isPacked) {
        if (!dims.empty()) {
            auto it = dims.begin();
            while (destType->getCanonicalType().kind == arrayKind) {
                if (it == dims.end()) {
                    errorDims(*dims.back());
                    return;
                }

                auto dim = isPacked ? context.evalPackedDimension(**it)
                                    : context.evalUnpackedDimension(**it);
                if (!dim || destType->getFixedRange() != *dim) {
                    errorDims(**it);
                    return;
                }

                destType = destType->getArrayElementType();
                it++;
            }

            if (it != dims.end() && !destType->isError()) {
                errorDims(**it);
                return;
            }
        }
    };

    // Unpacked dim checks have to come first because it unwraps the destType
    // for the packed one to look at.
    checkDims(unpackedDimensions, SymbolKind::FixedSizeUnpackedArrayType, false);
    checkDims(implicit.dimensions, SymbolKind::PackedArrayType, true);
}